

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O0

int __thiscall Fl_Tree_Item::remove_child(Fl_Tree_Item *this,char *name)

{
  int iVar1;
  Fl_Tree_Item *pFVar2;
  char *pcVar3;
  uint local_24;
  int t;
  char *name_local;
  Fl_Tree_Item *this_local;
  
  local_24 = 0;
  do {
    iVar1 = children(this);
    if (iVar1 <= (int)local_24) {
      return -1;
    }
    pFVar2 = child(this,local_24);
    pcVar3 = label(pFVar2);
    if (pcVar3 != (char *)0x0) {
      pFVar2 = child(this,local_24);
      pcVar3 = label(pFVar2);
      iVar1 = strcmp(pcVar3,name);
      if (iVar1 == 0) {
        Fl_Tree_Item_Array::remove(&this->_children,(char *)(ulong)local_24);
        recalc_tree(this);
        return 0;
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

int Fl_Tree_Item::remove_child(const char *name) {
  for ( int t=0; t<children(); t++ ) {
    if ( child(t)->label() ) {
      if ( strcmp(child(t)->label(), name) == 0 ) {
        _children.remove(t);
	recalc_tree();		// may change tree geometry
        return(0);
      }
    }
  }
  return(-1);
}